

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O3

int Gia_ObjCheckEdge(Gia_Man_t *p,int iObj,int iNext)

{
  uint uVar1;
  
  if ((-1 < iObj) && (iObj < p->vEdge1->nSize)) {
    uVar1 = 1;
    if (p->vEdge1->pArray[(uint)iObj] != iNext) {
      if (p->vEdge2->nSize <= iObj) goto LAB_001f83b0;
      uVar1 = (uint)(p->vEdge2->pArray[(uint)iObj] == iNext);
    }
    return uVar1;
  }
LAB_001f83b0:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Gia_ObjCheckEdge( Gia_Man_t * p, int iObj, int iNext )
{
    return Gia_ObjHaveEdge( p, iObj, iNext );
}